

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Reals __thiscall
Omega_h::tri_vert_normal_weights(Omega_h *this,Mesh *mesh,Adj *surf_verts2tris,LOs *tri2surf_tri)

{
  LO n;
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_118;
  undefined1 local_108 [8];
  type func;
  string local_90 [32];
  undefined1 local_70 [8];
  Write<double> weights;
  LO nweights;
  undefined1 local_50 [8];
  Reals coords;
  LOs fv2v;
  LO nsurf_verts;
  LOs *tri2surf_tri_local;
  Adj *surf_verts2tris_local;
  Mesh *mesh_local;
  
  n = Graph::nnodes(&surf_verts2tris->super_Graph);
  Mesh::ask_verts_of((Mesh *)&coords.write_.shared_alloc_.direct_ptr,(Int)mesh);
  Mesh::coords((Mesh *)local_50);
  size_in = Graph::nedges(&surf_verts2tris->super_Graph);
  weights.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"",(allocator *)((long)&func.coords.write_.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_70,size_in,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&func.coords.write_.shared_alloc_.direct_ptr + 7));
  Adj::Adj((Adj *)local_108,surf_verts2tris);
  Read<int>::Read((Read<int> *)&func.surf_verts2tris.codes.write_.shared_alloc_.direct_ptr,
                  tri2surf_tri);
  Write<double>::Write
            ((Write<double> *)&func.tri2surf_tri.write_.shared_alloc_.direct_ptr,
             (Write<double> *)local_70);
  Read<int>::Read((Read<int> *)&func.weights.shared_alloc_.direct_ptr,
                  (Read<int> *)&coords.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&func.fv2v.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_50);
  parallel_for<Omega_h::tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::__0>
            (n,(type *)local_108,"tri_vert_normal_weights");
  Write<double>::Write(&local_118,(Write<signed_char> *)local_70);
  Read<double>::Read((Read<double> *)this,&local_118);
  Write<double>::~Write(&local_118);
  tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)local_108);
  Write<double>::~Write((Write<double> *)local_70);
  Read<double>::~Read((Read<double> *)local_50);
  Read<int>::~Read((Read<int> *)&coords.write_.shared_alloc_.direct_ptr);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals tri_vert_normal_weights(
    Mesh* mesh, Adj surf_verts2tris, LOs tri2surf_tri) {
  auto nsurf_verts = surf_verts2tris.nnodes();
  auto fv2v = mesh->ask_verts_of(FACE);
  auto coords = mesh->coords();
  auto nweights = surf_verts2tris.nedges();
  auto weights = Write<Real>(nweights);
  auto func = OMEGA_H_LAMBDA(LO surf_vert) {
    for (auto vf = surf_verts2tris.a2ab[surf_vert];
         vf < surf_verts2tris.a2ab[surf_vert + 1]; ++vf) {
      auto f = surf_verts2tris.ab2b[vf];
      if (tri2surf_tri[f] < 0) {
        weights[vf] = 0.0;
        continue;
      }
      auto code = surf_verts2tris.codes[vf];
      auto ffv = code_which_down(code);
      auto rot = rotation_to_first(3, ffv);
      auto ffv2v_0 = gather_verts<3>(fv2v, f);
      Few<LO, 3> ffv2v;
      rotate_adj<3>(rot, ffv2v_0, 0, ffv2v, 0);
      auto ffv2p = gather_vectors<3, 3>(coords, ffv2v);
      auto b = simplex_basis<3, 2>(ffv2p);
      auto w =
          norm(cross(b[0], b[1])) / (norm_squared(b[0]) * norm_squared(b[1]));
      weights[vf] = w;
    }
  };
  parallel_for(nsurf_verts, func, "tri_vert_normal_weights");
  return weights;
}